

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

bitcount_t uECC_vli_numBits(uECC_word_t *vli,wordcount_t max_words)

{
  wordcount_t wVar1;
  uECC_word_t uStack_30;
  wordcount_t num_digits;
  uECC_word_t digit;
  uECC_word_t i;
  wordcount_t max_words_local;
  uECC_word_t *vli_local;
  
  wVar1 = vli_numDigits(vli,max_words);
  if (wVar1 == '\0') {
    vli_local._6_2_ = 0;
  }
  else {
    uStack_30 = vli[wVar1 + -1];
    digit = 0;
    for (; uStack_30 != 0; uStack_30 = uStack_30 >> 1) {
      digit = digit + 1;
    }
    vli_local._6_2_ = (wVar1 + -1) * 0x40 + (short)digit;
  }
  return vli_local._6_2_;
}

Assistant:

uECC_VLI_API bitcount_t uECC_vli_numBits(const uECC_word_t *vli, const wordcount_t max_words) {
    uECC_word_t i;
    uECC_word_t digit;

    wordcount_t num_digits = vli_numDigits(vli, max_words);
    if (num_digits == 0) {
        return 0;
    }

    digit = vli[num_digits - 1];
    for (i = 0; digit; ++i) {
        digit >>= 1;
    }

    return (((bitcount_t)(num_digits - 1) << uECC_WORD_BITS_SHIFT) + i);
}